

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O3

Vec_Ptr_t * If_ManReverseOrder(If_Man_t *p)

{
  uint *puVar1;
  bool bVar2;
  void *__ptr;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  uint uVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  size_t __size;
  
  __ptr = calloc(1,(long)p->nLevelMax * 8 + 8);
  pVVar4 = p->vObjs;
  iVar8 = pVVar4->nSize;
  if (0 < iVar8) {
    lVar3 = 0;
    do {
      puVar1 = (uint *)pVVar4->pArray[lVar3];
      uVar6 = *puVar1 >> 0xd;
      if ((uint)p->nLevelMax < uVar6) {
        __assert_fail("pObj->Level >= 0 && pObj->Level <= (unsigned)p->nLevelMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifUtil.c"
                      ,0x176,"Vec_Ptr_t *If_ManReverseOrder(If_Man_t *)");
      }
      *(undefined8 *)(puVar1 + 0x10) = *(undefined8 *)((long)__ptr + (ulong)uVar6 * 8);
      *(uint **)((long)__ptr + (ulong)uVar6 * 8) = puVar1;
      lVar3 = lVar3 + 1;
      pVVar4 = p->vObjs;
      iVar8 = pVVar4->nSize;
    } while (lVar3 < iVar8);
  }
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar8 - 1U) {
    iVar9 = iVar8;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar9;
  if (iVar9 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar9 << 3);
  }
  pVVar4->pArray = ppvVar5;
  if (-1 < (long)p->nLevelMax) {
    lVar10 = 0;
    lVar3 = (long)p->nLevelMax;
    do {
      pvVar7 = *(void **)((long)__ptr + lVar3 * 8);
      if (pvVar7 != (void *)0x0) {
        iVar8 = (int)lVar10;
        lVar10 = (long)iVar8;
        iVar8 = iVar8 * 2;
        __size = lVar10 << 4;
        do {
          if ((int)lVar10 == iVar9) {
            ppvVar5 = pVVar4->pArray;
            if (lVar10 < 0x10) {
              if (ppvVar5 == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
              }
              else {
                ppvVar5 = (void **)realloc(ppvVar5,0x80);
              }
              pVVar4->pArray = ppvVar5;
              iVar9 = 0x10;
            }
            else {
              if (ppvVar5 == (void **)0x0) {
                ppvVar5 = (void **)malloc(__size);
              }
              else {
                ppvVar5 = (void **)realloc(ppvVar5,__size);
              }
              pVVar4->pArray = ppvVar5;
              iVar9 = iVar8;
            }
          }
          else {
            ppvVar5 = pVVar4->pArray;
          }
          ppvVar5[lVar10] = pvVar7;
          lVar10 = lVar10 + 1;
          pvVar7 = *(void **)((long)pvVar7 + 0x40);
          iVar8 = iVar8 + 2;
          __size = __size + 0x10;
        } while (pvVar7 != (void *)0x0);
        pVVar4->nSize = (int)lVar10;
        pVVar4->nCap = iVar9;
      }
      bVar2 = 0 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * If_ManReverseOrder( If_Man_t * p )
{
    Vec_Ptr_t * vOrder;
    If_Obj_t * pObj, ** ppStore;
    int i;
    // allocate place to store the nodes
    ppStore = ABC_ALLOC( If_Obj_t *, p->nLevelMax + 1 );
    memset( ppStore, 0, sizeof(If_Obj_t *) * (p->nLevelMax + 1) );
    // add the nodes
    If_ManForEachObj( p, pObj, i )
    {
        assert( pObj->Level >= 0 && pObj->Level <= (unsigned)p->nLevelMax );
        pObj->pCopy = (char *)ppStore[pObj->Level]; 
        ppStore[pObj->Level] = pObj;
    }
    vOrder = Vec_PtrAlloc( If_ManObjNum(p) );
    for ( i = p->nLevelMax; i >= 0; i-- )
        for ( pObj = ppStore[i]; pObj; pObj = (If_Obj_t *)pObj->pCopy )
            Vec_PtrPush( vOrder, pObj );
    ABC_FREE( ppStore );
    // print the order
//    Vec_PtrForEachEntry( If_Obj_t *, vOrder, pObj, i )
//        Abc_Print( 1, "Obj %2d   Type %d  Level = %d\n", pObj->Id, pObj->Type, pObj->Level );
    return vOrder;
}